

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_7z.cpp
# Opt level: O0

bool __thiscall F7ZFile::Open(F7ZFile *this,bool quiet)

{
  UInt32 file_index;
  UInt64 *pUVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  unsigned_short uVar4;
  uint uVar5;
  SRes SVar6;
  C7zArchive *pCVar7;
  ulong uVar8;
  ulong uVar9;
  ulong *puVar10;
  char *pcVar11;
  unsigned_short *puVar12;
  char *pcVar13;
  F7ZLump *pFVar14;
  ulong uVar15;
  F7ZLump *local_e8;
  undefined1 local_a0 [8];
  TArray<char,_char> temp;
  FString local_88;
  FString name;
  size_t c;
  size_t nameLength;
  undefined1 local_68 [4];
  DWORD i;
  TArray<char,_char> nameASCII;
  TArray<unsigned_short,_unsigned_short> nameUTF16;
  F7ZLump *lump_p;
  CSzArEx *archPtr;
  int local_30;
  SRes res;
  int skipped;
  bool quiet_local;
  F7ZFile *this_local;
  
  pCVar7 = (C7zArchive *)operator_new(0x4140);
  C7zArchive::C7zArchive(pCVar7,(this->super_FResourceFile).Reader);
  this->Archive = pCVar7;
  local_30 = 0;
  uVar5 = C7zArchive::Open(this->Archive);
  if (uVar5 != 0) {
    pCVar7 = this->Archive;
    if (pCVar7 != (C7zArchive *)0x0) {
      C7zArchive::~C7zArchive(pCVar7);
      operator_delete(pCVar7,0x4140);
    }
    this->Archive = (C7zArchive *)0x0;
    if (!quiet) {
      Printf("\n\x1cG%s: ",(this->super_FResourceFile).Filename);
      if (uVar5 == 4) {
        Printf("Decoder does not support this archive\n");
      }
      else if (uVar5 == 2) {
        Printf("Cannot allocate memory\n");
      }
      else if (uVar5 == 3) {
        Printf("CRC error\n");
      }
      else {
        Printf("error #%d\n",(ulong)uVar5);
      }
    }
    this_local._7_1_ = 0;
    goto LAB_006d5245;
  }
  pCVar7 = this->Archive;
  (this->super_FResourceFile).NumLumps = (pCVar7->DB).NumFiles;
  uVar8 = CONCAT44(0,(this->super_FResourceFile).NumLumps);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar8;
  uVar9 = SUB168(auVar2 * ZEXT816(0x50),0);
  uVar15 = uVar9 + 8;
  if (SUB168(auVar2 * ZEXT816(0x50),8) != 0 || 0xfffffffffffffff7 < uVar9) {
    uVar15 = 0xffffffffffffffff;
  }
  puVar10 = (ulong *)operator_new__(uVar15);
  *puVar10 = uVar8;
  pFVar14 = (F7ZLump *)(puVar10 + 1);
  if (uVar8 != 0) {
    local_e8 = pFVar14;
    do {
      F7ZLump::F7ZLump(local_e8);
      local_e8 = local_e8 + 1;
    } while (local_e8 != pFVar14 + uVar8);
  }
  this->Lumps = pFVar14;
  nameUTF16._8_8_ = this->Lumps;
  TArray<unsigned_short,_unsigned_short>::TArray
            ((TArray<unsigned_short,_unsigned_short> *)&nameASCII.Most);
  TArray<char,_char>::TArray((TArray<char,_char> *)local_68);
  for (nameLength._4_4_ = 0; nameLength._4_4_ < (this->super_FResourceFile).NumLumps;
      nameLength._4_4_ = nameLength._4_4_ + 1) {
    if (((uint)(pCVar7->DB).IsDirs[nameLength._4_4_ >> 3] & 0x80 >> ((byte)nameLength._4_4_ & 7)) ==
        0) {
      pcVar11 = (char *)SzArEx_GetFileNameUtf16(&pCVar7->DB,(ulong)nameLength._4_4_,(UInt16 *)0x0);
      if (pcVar11 == (char *)0x0) {
        local_30 = local_30 + 1;
      }
      else {
        c._0_4_ = (uint)pcVar11;
        TArray<unsigned_short,_unsigned_short>::Resize
                  ((TArray<unsigned_short,_unsigned_short> *)&nameASCII.Most,(uint)c);
        TArray<char,_char>::Resize((TArray<char,_char> *)local_68,(uint)c);
        puVar12 = TArray<unsigned_short,_unsigned_short>::operator[]
                            ((TArray<unsigned_short,_unsigned_short> *)&nameASCII.Most,0);
        SzArEx_GetFileNameUtf16(&pCVar7->DB,(ulong)nameLength._4_4_,puVar12);
        for (name.Chars = (char *)0x0; name.Chars < pcVar11; name.Chars = name.Chars + 1) {
          puVar12 = TArray<unsigned_short,_unsigned_short>::operator[]
                              ((TArray<unsigned_short,_unsigned_short> *)&nameASCII.Most,
                               (size_t)name.Chars);
          uVar4 = *puVar12;
          pcVar13 = TArray<char,_char>::operator[]((TArray<char,_char> *)local_68,name.Chars);
          *pcVar13 = (char)uVar4;
        }
        pcVar11 = TArray<char,_char>::operator[]((TArray<char,_char> *)local_68,0);
        FixPathSeperator(pcVar11);
        pcVar11 = TArray<char,_char>::operator[]((TArray<char,_char> *)local_68,0);
        FString::FString(&local_88,pcVar11);
        FString::ToLower(&local_88);
        FString::FString((FString *)&temp.Most,&local_88);
        FResourceLump::LumpNameSetup((FResourceLump *)nameUTF16._8_8_,(FString *)&temp.Most);
        FString::~FString((FString *)&temp.Most);
        pUVar1 = (pCVar7->DB).UnpackPositions;
        *(int *)(nameUTF16._8_8_ + 8) =
             (int)pUVar1[nameLength._4_4_ + 1] - (int)pUVar1[nameLength._4_4_];
        *(F7ZFile **)(nameUTF16._8_8_ + 0x38) = this;
        *(undefined1 *)(nameUTF16._8_8_ + 0x28) = 2;
        *(uint *)(nameUTF16._8_8_ + 0x4c) = nameLength._4_4_;
        FResourceLump::CheckEmbedded((FResourceLump *)nameUTF16._8_8_);
        nameUTF16._8_8_ = nameUTF16._8_8_ + 0x50;
        FString::~FString(&local_88);
      }
    }
    else {
      local_30 = local_30 + 1;
    }
  }
  (this->super_FResourceFile).NumLumps = (this->super_FResourceFile).NumLumps - local_30;
  if ((this->super_FResourceFile).NumLumps == 0) {
LAB_006d51ca:
    if ((!quiet) && ((batchrun & 1U) == 0)) {
      Printf(", %d lumps\n",(ulong)(this->super_FResourceFile).NumLumps);
    }
    FResourceFile::PostProcessArchive(&this->super_FResourceFile,this->Lumps,0x50);
    this_local._7_1_ = 1;
  }
  else {
    TArray<char,_char>::TArray((TArray<char,_char> *)local_a0);
    TArray<char,_char>::Resize
              ((TArray<char,_char> *)local_a0,(this->Lumps->super_FResourceLump).LumpSize);
    pCVar7 = this->Archive;
    file_index = *(UInt32 *)&(this->Lumps->super_FResourceLump).field_0x4c;
    pcVar11 = TArray<char,_char>::operator[]((TArray<char,_char> *)local_a0,0);
    SVar6 = C7zArchive::Extract(pCVar7,file_index,pcVar11);
    if (SVar6 == 0) {
      bVar3 = false;
    }
    else {
      if (!quiet) {
        Printf("\n%s: unsupported 7z/LZMA file!\n",(this->super_FResourceFile).Filename);
      }
      this_local._7_1_ = 0;
      bVar3 = true;
    }
    TArray<char,_char>::~TArray((TArray<char,_char> *)local_a0);
    if (!bVar3) goto LAB_006d51ca;
  }
  TArray<char,_char>::~TArray((TArray<char,_char> *)local_68);
  TArray<unsigned_short,_unsigned_short>::~TArray
            ((TArray<unsigned_short,_unsigned_short> *)&nameASCII.Most);
LAB_006d5245:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool F7ZFile::Open(bool quiet)
{
	Archive = new C7zArchive(Reader);
	int skipped = 0;
	SRes res;

	res = Archive->Open();
	if (res != SZ_OK)
	{
		delete Archive;
		Archive = NULL;
		if (!quiet)
		{
			Printf("\n" TEXTCOLOR_RED "%s: ", Filename);
			if (res == SZ_ERROR_UNSUPPORTED)
			{
				Printf("Decoder does not support this archive\n");
			}
			else if (res == SZ_ERROR_MEM)
			{
				Printf("Cannot allocate memory\n");
			}
			else if (res == SZ_ERROR_CRC)
			{
				Printf("CRC error\n");
			}
			else
			{
				Printf("error #%d\n", res);
			}
		}
		return false;
	}

	CSzArEx* const archPtr = &Archive->DB;

	NumLumps = archPtr->NumFiles;
	Lumps = new F7ZLump[NumLumps];

	F7ZLump *lump_p = Lumps;
	TArray<UInt16> nameUTF16;
	TArray<char> nameASCII;

	for (DWORD i = 0; i < NumLumps; ++i)
	{
		// skip Directories
		if (SzArEx_IsDir(archPtr, i))
		{
			skipped++;
			continue;
		}

		const size_t nameLength = SzArEx_GetFileNameUtf16(archPtr, i, NULL);

		if (0 == nameLength)
		{
			++skipped;
			continue;
		}

		nameUTF16.Resize((unsigned)nameLength);
		nameASCII.Resize((unsigned)nameLength);
		SzArEx_GetFileNameUtf16(archPtr, i, &nameUTF16[0]);
		for (size_t c = 0; c < nameLength; ++c)
		{
			nameASCII[c] = static_cast<char>(nameUTF16[c]);
		}
		FixPathSeperator(&nameASCII[0]);

		FString name = &nameASCII[0];
		name.ToLower();

		lump_p->LumpNameSetup(name);
		lump_p->LumpSize = static_cast<int>(SzArEx_GetFileSize(archPtr, i));
		lump_p->Owner = this;
		lump_p->Flags = LUMPF_ZIPFILE;
		lump_p->Position = i;
		lump_p->CheckEmbedded();
		lump_p++;
	}
	// Resize the lump record array to its actual size
	NumLumps -= skipped;

	if (NumLumps > 0)
	{
		// Quick check for unsupported compression method

		TArray<char> temp;
		temp.Resize(Lumps[0].LumpSize);

		if (SZ_OK != Archive->Extract(Lumps[0].Position, &temp[0]))
		{
			if (!quiet) Printf("\n%s: unsupported 7z/LZMA file!\n", Filename);
			return false;
		}
	}

	if (!quiet && !batchrun) Printf(", %d lumps\n", NumLumps);

	PostProcessArchive(&Lumps[0], sizeof(F7ZLump));
	return true;
}